

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O1

void __thiscall ON_XMLVariant::StringToPoint(ON_XMLVariant *this,int numValues)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  bool bVar3;
  int i;
  int iVar4;
  long lVar5;
  wchar_t *__nptr;
  ulong uVar6;
  double dVar7;
  ON_wString s;
  ON_wString OStack_38;
  
  if ((0x10 < (uint)numValues) || (bVar3 = ON_wString::IsEmpty(&this->_private->_string_val), bVar3)
     ) {
    lVar5 = 0;
    do {
      *(undefined8 *)((long)&this->_private->field_2 + lVar5 * 8) = 0;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x10);
  }
  else {
    ON_wString::operator+(&OStack_38,(wchar_t *)&this->_private->_string_val);
    __nptr = ON_wString::operator_cast_to_wchar_t_(&OStack_38);
    if (numValues != 0) {
      uVar6 = 0;
      do {
        __nptr = __nptr + -1;
        do {
          pwVar1 = __nptr + 1;
          __nptr = __nptr + 1;
          iVar4 = iswspace(*pwVar1);
        } while (iVar4 != 0);
        wVar2 = *__nptr;
        if (((uint)(wVar2 + L'\xffffffd0') < 10) ||
           (((uint)wVar2 < 0x2f && ((0x680000000000U >> ((ulong)(uint)wVar2 & 0x3f) & 1) != 0)))) {
          dVar7 = wcstod(__nptr,(wchar_t **)0x0);
          *(double *)((long)&this->_private->field_2 + uVar6 * 8) = dVar7;
        }
        do {
          wVar2 = *__nptr;
          __nptr = __nptr + 1;
        } while (wVar2 != L',');
        ON_REMOVE_ASAP_AssertEx
                  (1,
                   "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_xml.cpp"
                   ,0x4fd,"","*p == L\',\' is false");
        uVar6 = uVar6 + 1;
      } while (uVar6 != (uint)numValues);
    }
    ON_wString::~ON_wString(&OStack_38);
  }
  return;
}

Assistant:

void ON_XMLVariant::StringToPoint(int numValues) const
{
  // 22nd September 2022 John Croudy, https://mcneel.myjetbrains.com/youtrack/issue/RH-77182
  // This function crashed on the Mac inside wcstod_l() which must be getting called from the call to
  // ON_wtof(). The only way that function can fail is if either the input pointers are invalid or the
  // input string or locale is corrupted. I don't have any control over the locale (I don't even know
  // how it's being accessed on the Mac), so all I can do is check the input string. It's unlikely that
  // an incorrectly formatted string (i.e., not a float) would cause a crash, but I can do some simple
  // validation to try and avoid trouble.

  bool good = true;

  if ((numValues < 0) || (numValues > _private->array_val_max))
  {
    good = false;
  }
  else
  if (_private->_string_val.IsEmpty())
  {
    good = false;
  }

  if (good)
  {
    ON_wString s = _private->_string_val + L",0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,";

    auto* p = static_cast<const wchar_t*>(s);
    for (int i = 0; i < numValues; i++)
    {
      // Skip white space. iswspace() returns 0 for the terminator so we can't go off the end of the buffer.
      while (0 != iswspace(*p))
      {
        p++;
      }

      // Quick and simple sanity check at the start of a float value.
      if (isdigit(*p) || (*p == '.') || (*p == '+') || (*p == '-'))
      {
        _private->_array_val[i] = ON_wtof(p);
      }

      // Because we've appended a fixed string containing commas, we know the pointer can't go off
      // the end of the buffer while checking for a comma.
      while (*p != L',')
      {
        p++;
      }

      // 'p' is now pointing to a comma.
      ON_ASSERT(*p == L',');

      // After incrementing it, the worst case scenario is that it's pointing to the terminator.
      p++;
    }
  }
  else
  {
    // Bad input; clear the result to all zeroes.
    for (int i = 0; i < _private->array_val_max; i++)
    {
      _private->_array_val[i] = 0.0;
    }
  }
}